

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O1

void sbs_printf(sbstring *sbs,char *format,...)

{
  char in_AL;
  uint uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  uVar2 = (long)sbs->end - (long)sbs->begin;
  if (uVar2 < sbs->size) {
    local_d8 = local_c8;
    local_e0 = &argp[0].overflow_arg_area;
    local_e8 = 0x3000000010;
    local_b8 = in_RDX;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    uVar1 = vsnprintf(sbs->end,sbs->size - uVar2,format,&local_e8);
    if (0 < (int)uVar1) {
      uVar2 = sbs->size - uVar2;
      if (uVar2 <= uVar1) {
        uVar1 = (int)uVar2 - 1;
        sbs->end[(int)uVar1] = '\0';
      }
      sbs->end = sbs->end + (int)uVar1;
    }
  }
  return;
}

Assistant:

void sbs_printf(struct sbstring *sbs, const char *format, ...)
{
    size_t size = (sbs->end - sbs->begin);

    if (size < sbs->size) {
        va_list argp;
        va_start(argp, format);
        int bytes = vsnprintf(sbs->end, sbs->size - size, format, argp);
        if (bytes > 0) {
            if ((size_t)bytes >= sbs->size - size) {
                bytes = (int)(sbs->size - size - 1);
                /* terminate truncated output */
                sbs->end[bytes] = '\0';
            }
            sbs->end += bytes;
        }
        va_end(argp);
    }
}